

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_cylinder(rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
                     rf_color color)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Bool _Var5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float __x;
  undefined4 local_38;
  undefined4 uStack_34;
  
  uVar6 = 3;
  if (3 < sides) {
    uVar6 = sides;
  }
  _Var5 = rf_gfx_check_buffer_limit(uVar6 * 6);
  if (_Var5) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = position.x;
  uStack_34 = position.y;
  rf_gfx_translatef(local_38,uStack_34,position.z);
  rf_gfx_begin(RF_TRIANGLES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  uVar8 = CONCAT44(0,uVar6);
  if (radius_top <= 0.0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    for (uVar7 = 0; uVar7 < 0x168;
        uVar7 = uVar7 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar2,0)) {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar9 = sinf((float)(long)uVar7 * 0.017453292);
      fVar10 = cosf((float)(long)uVar7 * 0.017453292);
      rf_gfx_vertex3f(fVar9 * radius_bottom,0.0,fVar10 * radius_bottom);
      fVar9 = (float)(long)(0x168 / (ulong)uVar6 + uVar7) * 0.017453292;
      fVar10 = sinf(fVar9);
      fVar9 = cosf(fVar9);
      rf_gfx_vertex3f(fVar10 * radius_bottom,0.0,fVar9 * radius_bottom);
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    for (uVar7 = 0; uVar7 < 0x168;
        uVar7 = uVar7 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar1,0)) {
      __x = (float)(long)uVar7 * 0.017453292;
      fVar9 = sinf(__x);
      fVar10 = cosf(__x);
      rf_gfx_vertex3f(fVar9 * radius_bottom,0.0,fVar10 * radius_bottom);
      fVar9 = (float)(long)(0x168 / (ulong)uVar6 + uVar7) * 0.017453292;
      fVar10 = sinf(fVar9);
      fVar11 = cosf(fVar9);
      rf_gfx_vertex3f(fVar10 * radius_bottom,0.0,fVar11 * radius_bottom);
      fVar10 = sinf(fVar9);
      fVar11 = cosf(fVar9);
      rf_gfx_vertex3f(fVar10 * radius_top,height,fVar11 * radius_top);
      fVar10 = sinf(__x);
      fVar11 = cosf(__x);
      rf_gfx_vertex3f(fVar10 * radius_top,height,fVar11 * radius_top);
      fVar10 = sinf(__x);
      fVar11 = cosf(__x);
      rf_gfx_vertex3f(fVar10 * radius_bottom,0.0,fVar11 * radius_bottom);
      fVar10 = sinf(fVar9);
      fVar9 = cosf(fVar9);
      rf_gfx_vertex3f(fVar10 * radius_top,height,fVar9 * radius_top);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    for (uVar7 = 0; uVar7 < 0x168;
        uVar7 = uVar7 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar3,0)) {
      rf_gfx_vertex3f(0.0,height,0.0);
      fVar9 = sinf((float)(long)uVar7 * 0.017453292);
      fVar10 = cosf((float)(long)uVar7 * 0.017453292);
      rf_gfx_vertex3f(fVar9 * radius_top,height,fVar10 * radius_top);
      fVar9 = (float)(long)(0x168 / (ulong)uVar6 + uVar7) * 0.017453292;
      fVar10 = sinf(fVar9);
      fVar9 = cosf(fVar9);
      rf_gfx_vertex3f(fVar10 * radius_top,height,fVar9 * radius_top);
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  for (uVar8 = 0; uVar8 < 0x168;
      uVar8 = uVar8 + SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x168)) / auVar4,0)) {
    rf_gfx_vertex3f(0.0,0.0,0.0);
    fVar10 = (float)(long)(0x168 / (ulong)uVar6 + uVar8) * 0.017453292;
    fVar9 = sinf(fVar10);
    fVar10 = cosf(fVar10);
    rf_gfx_vertex3f(fVar9 * radius_bottom,0.0,fVar10 * radius_bottom);
    fVar9 = sinf((float)(long)uVar8 * 0.017453292);
    fVar10 = cosf((float)(long)uVar8 * 0.017453292);
    rf_gfx_vertex3f(fVar9 * radius_bottom,0.0,fVar10 * radius_bottom);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    if (radius_top > 0)
    {
        // Draw Body -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360 / sides)
        {
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0, cosf(RF_DEG2RAD * i) * radius_bottom);                                   // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom, 0,   cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_bottom); // Bottom Right
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top);    // Top Right

            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_top, height, cosf(RF_DEG2RAD * i) * radius_top);                                 // Top Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * i) * radius_bottom, 0,   cosf(RF_DEG2RAD * i) * radius_bottom);                              // Bottom Left
            rf_gfx_vertex3f(sinf(RF_DEG2RAD * (i + 360 / sides)) * radius_top, height, cosf(RF_DEG2RAD * (i + 360 / sides)) * radius_top); // Top Right
        }

        // Draw Cap --------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        }
    }
    else
    {
        // Draw Cone -------------------------------------------------------------------------------------
        for (rf_int i = 0; i < 360; i += 360/sides)
        {
            rf_gfx_vertex3f(0, height, 0);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
            rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        }
    }

    // Draw Base -----------------------------------------------------------------------------------------
    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(0, 0, 0);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }

    rf_gfx_end();
    rf_gfx_pop_matrix();
}